

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenStageInfo
          (InstrumentPass *this,uint32_t stage_idx,InstructionBuilder *builder)

{
  InstrumentPass *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  Instruction *pIVar6;
  Instruction *this_00;
  uint32_t u;
  long lVar7;
  uint __tmp;
  uint32_t operand1;
  IRContext *this_01;
  bool bVar8;
  uint uVar9;
  undefined1 local_78 [16];
  pointer local_68;
  InstrumentPass *local_58;
  uint32_t *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar3 = InstructionBuilder::GetUintConstantId(builder,0);
  puVar5 = (uint32_t *)operator_new(0x10);
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5 + 4;
  *puVar5 = uVar3;
  puVar5[1] = uVar3;
  puVar5[2] = uVar3;
  puVar5[3] = uVar3;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar5;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar3 = InstructionBuilder::GetUintConstantId(builder,stage_idx);
  *puVar5 = uVar3;
  local_58 = this;
  if (0x14c0 < (int)stage_idx) {
    if (stage_idx - 0x14c1 < 6) {
      uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,0x14c7);
      uVar3 = GenVarLoad(this,uVar3,builder);
      lVar7 = 0;
      do {
        uVar4 = GetUintId(this);
        local_78 = (undefined1  [16])0x0;
        local_68 = (pointer)0x0;
        local_78._0_8_ = operator_new(4);
        local_68 = (pointer)(local_78._0_8_ + 4);
        *(int *)local_78._0_8_ = (int)lVar7;
        local_78._8_8_ = local_68;
        pIVar6 = InstructionBuilder::AddCompositeExtract
                           (builder,uVar4,uVar3,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        uVar4 = 0;
        if (pIVar6->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
        }
        puVar5[lVar7 + 1] = uVar4;
        if ((pointer)local_78._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
        }
        lVar7 = lVar7 + 1;
        this = local_58;
      } while (lVar7 != 3);
      goto LAB_002286fa;
    }
    uVar9 = stage_idx - 0x14f4;
LAB_00228310:
    if (1 < uVar9) {
      __assert_fail("false && \"unsupported stage\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                    ,0x115,
                    "uint32_t spvtools::opt::InstrumentPass::GenStageInfo(uint32_t, InstructionBuilder *)"
                   );
    }
switchD_002281f8_caseD_5:
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,0x1c);
    uVar3 = GenVarLoad(this,uVar3,builder);
    lVar7 = 0;
    do {
      uVar4 = GetUintId(this);
      local_78 = (undefined1  [16])0x0;
      local_68 = (pointer)0x0;
      local_78._0_8_ = operator_new(4);
      local_68 = (pointer)(local_78._0_8_ + 4);
      *(int *)local_78._0_8_ = (int)lVar7;
      local_78._8_8_ = local_68;
      pIVar6 = InstructionBuilder::AddCompositeExtract
                         (builder,uVar4,uVar3,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      uVar4 = 0;
      if (pIVar6->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
      }
      puVar5[lVar7 + 1] = uVar4;
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
      }
      lVar7 = lVar7 + 1;
      this = local_58;
    } while (lVar7 != 3);
    goto LAB_002286fa;
  }
  switch(stage_idx) {
  case 0:
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,0x2a);
    uVar3 = GenVarLoad(this,uVar3,builder);
    uVar3 = GenUintCastCode(this,uVar3,builder);
    puVar5[1] = uVar3;
    this_01 = (this->super_Pass).context_;
    uVar3 = 0x2b;
    break;
  case 1:
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,8);
    uVar3 = GenVarLoad(this,uVar3,builder);
    uVar3 = GenUintCastCode(this,uVar3,builder);
    puVar5[1] = uVar3;
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,7);
    uVar3 = GenVarLoad(this,uVar3,builder);
    goto LAB_0022846b;
  case 2:
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,7);
    uVar3 = GenVarLoad(this,uVar3,builder);
    puVar5[1] = uVar3;
    local_50 = puVar5;
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,0xd);
    uVar4 = GenVarLoad(this,uVar3,builder);
    uVar3 = this->v3uint_id_;
    if (uVar3 == 0) {
      uVar3 = GetVecUintId(this,3);
      this->v3uint_id_ = uVar3;
    }
    pIVar6 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar4);
    uVar3 = 0;
    if (pIVar6->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    lVar7 = 0;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      uVar4 = GetUintId(this);
      local_78 = (undefined1  [16])0x0;
      local_68 = (pointer)0x0;
      local_78._0_8_ = operator_new(4);
      local_68 = (pointer)(local_78._0_8_ + 4);
      *(int *)local_78._0_8_ = (int)lVar7;
      local_78._8_8_ = local_68;
      pIVar6 = InstructionBuilder::AddCompositeExtract
                         (builder,uVar4,uVar3,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      uVar4 = 0;
      if (pIVar6->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
      }
      local_50[lVar7 + 2] = uVar4;
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
      }
      lVar7 = 1;
      this = local_58;
      bVar2 = false;
    } while (bVar8);
    goto LAB_002286fa;
  case 3:
    uVar3 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,7);
    uVar3 = GenVarLoad(this,uVar3,builder);
    puVar5[1] = uVar3;
    this_01 = (this->super_Pass).context_;
    uVar3 = 8;
    break;
  case 4:
    uVar3 = GetVec4FloatId(this);
    uVar4 = IRContext::GetBuiltinInputVarId((this->super_Pass).context_,0xf);
    operand1 = 0;
    pIVar6 = InstructionBuilder::AddLoad(builder,uVar3,uVar4,0);
    pIVar1 = local_58;
    uVar3 = this->v4uint_id_;
    if (uVar3 == 0) {
      uVar3 = GetVecUintId(local_58,4);
      pIVar1->v4uint_id_ = uVar3;
    }
    local_50 = puVar5;
    if (pIVar6->has_result_id_ == true) {
      operand1 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    pIVar6 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,operand1);
    lVar7 = 0;
    this = local_58;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      uVar3 = GetUintId(this);
      uVar4 = 0;
      if (pIVar6->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
      }
      local_78 = (undefined1  [16])0x0;
      local_68 = (pointer)0x0;
      local_78._0_8_ = operator_new(4);
      local_68 = (pointer)(local_78._0_8_ + 4);
      *(int *)local_78._0_8_ = (int)lVar7;
      local_78._8_8_ = local_68;
      this_00 = InstructionBuilder::AddCompositeExtract
                          (builder,uVar3,uVar4,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      uVar3 = 0;
      if (this_00->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      this = local_58;
      local_50[lVar7 + 1] = uVar3;
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
      }
      lVar7 = 1;
      bVar2 = false;
    } while (bVar8);
    goto LAB_002286fa;
  case 5:
    goto switchD_002281f8_caseD_5;
  default:
    uVar9 = stage_idx - 0x1493;
    goto LAB_00228310;
  }
  uVar3 = IRContext::GetBuiltinInputVarId(this_01,uVar3);
  uVar3 = GenVarLoad(this,uVar3,builder);
  uVar3 = GenUintCastCode(this,uVar3,builder);
LAB_0022846b:
  puVar5[2] = uVar3;
LAB_002286fa:
  uVar3 = this->v4uint_id_;
  if (uVar3 == 0) {
    uVar3 = GetVecUintId(this,4);
    this->v4uint_id_ = uVar3;
  }
  pIVar6 = InstructionBuilder::AddCompositeConstruct(builder,uVar3,&local_48);
  uVar3 = 0;
  if (pIVar6->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar3;
}

Assistant:

uint32_t InstrumentPass::GenStageInfo(uint32_t stage_idx,
                                      InstructionBuilder* builder) {
  std::vector<uint32_t> ids(4, builder->GetUintConstantId(0));
  ids[0] = builder->GetUintConstantId(stage_idx);
  // %289 = OpCompositeConstruct %v4uint %uint_0 %285 %288 %uint_0
  // TODO(greg-lunarg): Add support for all stages
  switch (spv::ExecutionModel(stage_idx)) {
    case spv::ExecutionModel::Vertex: {
      // Load and store VertexId and InstanceId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::VertexIndex)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);

      load_id = GenVarLoad(context()->GetBuiltinInputVarId(
                               uint32_t(spv::BuiltIn::InstanceIndex)),
                           builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::GLCompute:
    case spv::ExecutionModel::TaskNV:
    case spv::ExecutionModel::MeshNV:
    case spv::ExecutionModel::TaskEXT:
    case spv::ExecutionModel::MeshEXT: {
      // Load and store GlobalInvocationId.
      uint32_t load_id = GenVarLoad(context()->GetBuiltinInputVarId(uint32_t(
                                        spv::BuiltIn::GlobalInvocationId)),
                                    builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), load_id, {u})
                         ->result_id();
      }
    } break;
    case spv::ExecutionModel::Geometry: {
      // Load and store PrimitiveId and InvocationId.
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[2] = GenUintCastCode(load_id, builder);
    } break;
    case spv::ExecutionModel::TessellationControl: {
      // Load and store InvocationId and PrimitiveId
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::InvocationId)),
          builder);
      ids[1] = GenUintCastCode(load_id, builder);
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[2] = load_id;
    } break;
    case spv::ExecutionModel::TessellationEvaluation: {
      // Load and store PrimitiveId and TessCoord.uv
      uint32_t load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::PrimitiveId)),
          builder);
      ids[1] = load_id;
      load_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::TessCoord)),
          builder);
      Instruction* uvec3_cast_inst =
          builder->AddUnaryOp(GetVec3UintId(), spv::Op::OpBitcast, load_id);
      uint32_t uvec3_cast_id = uvec3_cast_inst->result_id();
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 2] =
            builder->AddCompositeExtract(GetUintId(), uvec3_cast_id, {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::Fragment: {
      // Load FragCoord and convert to Uint
      Instruction* frag_coord_inst = builder->AddLoad(
          GetVec4FloatId(),
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::FragCoord)));
      Instruction* uint_frag_coord_inst = builder->AddUnaryOp(
          GetVec4UintId(), spv::Op::OpBitcast, frag_coord_inst->result_id());
      for (uint32_t u = 0; u < 2u; ++u) {
        ids[u + 1] =
            builder
                ->AddCompositeExtract(GetUintId(),
                                      uint_frag_coord_inst->result_id(), {u})
                ->result_id();
      }
    } break;
    case spv::ExecutionModel::RayGenerationNV:
    case spv::ExecutionModel::IntersectionNV:
    case spv::ExecutionModel::AnyHitNV:
    case spv::ExecutionModel::ClosestHitNV:
    case spv::ExecutionModel::MissNV:
    case spv::ExecutionModel::CallableNV: {
      // Load and store LaunchIdNV.
      uint32_t launch_id = GenVarLoad(
          context()->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::LaunchIdNV)),
          builder);
      for (uint32_t u = 0; u < 3u; ++u) {
        ids[u + 1] = builder->AddCompositeExtract(GetUintId(), launch_id, {u})
                         ->result_id();
      }
    } break;
    default: { assert(false && "unsupported stage"); } break;
  }
  return builder->AddCompositeConstruct(GetVec4UintId(), ids)->result_id();
}